

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O3

SearchResult * search::search(SearchResult *__return_storage_ptr__,Position *pos,int depth)

{
  long lVar1;
  int *piVar2;
  SearchGlobals search_globals;
  array<search::SearchStack,_128UL> search_stack;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> local_b48;
  undefined1 local_b38 [144];
  bool local_aa8;
  undefined1 local_aa0 [112];
  bool local_a30 [8];
  SearchStack local_a28 [128];
  
  if (0 < (long)tt.size) {
    memset(tt.table,0,(long)tt.size << 6);
  }
  memset(local_a28,0,0xa00);
  lVar1 = 0xc;
  do {
    local_a30[lVar1] = false;
    *(undefined1 *)
     ((long)&local_a28[0].killer_moves._M_elems[0].super__Optional_base<libchess::Move,_true,_true>.
             _M_payload.super__Optional_payload_base<libchess::Move>._M_payload + lVar1) = 0;
    lVar1 = lVar1 + 0x14;
  } while (lVar1 != 0xa0c);
  piVar2 = &local_a28[0].ply;
  lVar1 = 0;
  do {
    *piVar2 = (int)lVar1;
    *(bool *)(piVar2 + -3) = false;
    *(bool *)(piVar2 + -1) = false;
    lVar1 = lVar1 + 1;
    piVar2 = piVar2 + 5;
  } while (lVar1 != 0x80);
  local_b48.super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>.
  _M_engaged = false;
  local_a30[0] = false;
  SearchGlobals::new_search_globals
            ((SearchGlobals *)local_b38,&local_b48,(optional<libchess::UCIGoParameters> *)local_aa0)
  ;
  if ((local_a30[0] == true) && (local_a30[0] = false, (bool)local_aa0[0x68] == true)) {
    local_aa0[0x68] = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_aa0 + 0x50));
  }
  search_impl(__return_storage_ptr__,pos,-0x7531,0x7531,depth,local_a28,(SearchGlobals *)local_b38);
  if ((local_aa8 == true) && (local_aa8 = false, (bool)local_b38[0x88] == true)) {
    local_b38[0x88] = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_b38 + 0x70));
  }
  return __return_storage_ptr__;
}

Assistant:

SearchResult search(Position& pos, int depth) {
    tt.clear();
    auto search_stack = SearchStack::new_search_stack();
    auto search_globals = SearchGlobals::new_search_globals();
    int alpha = -INFINITE;
    int beta = +INFINITE;
    SearchResult search_result =
        search_impl(pos, alpha, beta, depth, search_stack.begin(), search_globals);
    return search_result;
}